

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int ixxx::posix::execv(char *__path,char **__argv)

{
  int iVar1;
  execv_error *this;
  int *piVar2;
  int r;
  char **argv_local;
  char *path_local;
  
  iVar1 = ::execv(__path,__argv);
  if (iVar1 == -1) {
    this = (execv_error *)__cxa_allocate_exception(0x20);
    piVar2 = __errno_location();
    execv_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
    __cxa_throw(this,&execv_error::typeinfo,execv_error::~execv_error);
  }
  return iVar1;
}

Assistant:

void execv(const char *path, char *const *argv)
    {
        int r = ::execv(path, argv);
        if (r == -1)
            throw execv_error(errno);
    }